

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Mat4 *matrixArray,size_t length)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  UniformBinder binder;
  vector<float,_std::allocator<float>_> contiguous;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&contiguous,length << 4,(allocator_type *)&binder);
  lVar2 = 0;
  sVar1 = length;
  while (bVar3 = sVar1 != 0, sVar1 = sVar1 - 1, bVar3) {
    priv::copyMatrix((float *)((long)matrixArray->array + lVar2),0x10,
                     (float *)((long)contiguous.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + 0x40;
  }
  UniformBinder::UniformBinder(&binder,this,name);
  if (binder.location != -1) {
    (*sf_ptrc_glUniformMatrix4fvARB)
              (binder.location,(GLsizei)length,'\0',
               contiguous.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Shader.cpp"
                       ,0x293,
                       "GLEXT_glUniformMatrix4fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, &contiguous[0])"
                      );
  }
  UniformBinder::~UniformBinder(&binder);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&contiguous.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Mat4* matrixArray, std::size_t length)
{
    const std::size_t matrixSize = 4 * 4;

    std::vector<float> contiguous(matrixSize * length);
    for (std::size_t i = 0; i < length; ++i)
        priv::copyMatrix(matrixArray[i].array, matrixSize, &contiguous[matrixSize * i]);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniformMatrix4fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, &contiguous[0]));
}